

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::moveRect(QWidgetPrivate *this,QRect *rect,int dx,int dy)

{
  uint uVar1;
  QWidget *this_00;
  QWidget *this_01;
  QWidgetPrivate *this_02;
  QWExtra *pQVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  QRect QVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  QWidget *parent;
  QWidgetRepaintManager *this_03;
  QRegion *r;
  long in_FS_OFFSET;
  QRect QVar10;
  QRegion local_c8;
  QPoint local_c0;
  QRegion childExpose;
  QRegion parentExpose;
  undefined8 local_a0;
  QRegion parentRegion;
  QRect local_90;
  QRect local_80;
  QRect local_70;
  QRect local_60;
  QRect local_50;
  QPoint local_40;
  long local_38;
  
  QVar6._8_8_ = local_70._8_8_;
  QVar6._0_8_ = local_70._0_8_;
  QVar10._8_8_ = local_90._8_8_;
  QVar10._0_8_ = local_90._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((dy == 0 && dx == 0) ||
     (this_00 = *(QWidget **)&this->field_0x8, local_90 = QVar10, local_70 = QVar6,
     (this_00->data->widget_attributes & 0x8000) == 0)) goto LAB_0030cf16;
  parent = QWidget::window(this_00);
  if (moveRect(QRect_const&,int,int)::accelEnv == '\0') {
    iVar9 = __cxa_guard_acquire(&moveRect(QRect_const&,int,int)::accelEnv);
    if (iVar9 != 0) {
      iVar9 = qEnvironmentVariableIntValue("QT_NO_FAST_MOVE",(bool *)0x0);
      moveRect::accelEnv = iVar9 == 0;
      __cxa_guard_release(&moveRect(QRect_const&,int,int)::accelEnv);
    }
  }
  this_01 = *(QWidget **)(*(long *)&this_00->field_0x8 + 0x10);
  auVar5._8_8_ = 0;
  auVar5._0_4_ = local_50.x2.m_i;
  auVar5._4_4_ = local_50.y2.m_i;
  local_50 = (QRect)(auVar5 << 0x40);
  local_40 = QWidget::mapTo(this_01,parent,(QPoint *)&local_50);
  this_02 = *(QWidgetPrivate **)&this_01->field_0x8;
  local_50 = clipRect(this_02);
  local_60 = QRect::translated(rect,dx,dy);
  local_70 = (QRect)QRect::operator&(rect,&local_50);
  QVar10 = local_70;
  if ((local_70.x1.m_i.m_i <= local_70.x2.m_i.m_i) && (local_70.y1.m_i.m_i <= local_70.y2.m_i.m_i))
  {
    local_80 = QRect::translated(&local_70,dx,dy);
    QVar10 = (QRect)QRect::operator&(&local_80,&local_50);
  }
  local_70 = QVar10;
  QVar10 = QRect::translated(&local_70,-dx,-dy);
  local_80 = QVar10;
  local_90 = (QRect)QRect::operator&(rect,&local_50);
  if ((this->field_0x253 & 2) == 0) {
    bVar7 = false;
  }
  else {
    bVar7 = hasPlatformWindow(this_00);
  }
  if ((((moveRect::accelEnv == true) && (bVar7 == false && (this->field_0x252 & 2) != 0)) &&
      (QVar10.x1.m_i.m_i <= QVar10.x2.m_i.m_i)) &&
     ((QVar10.y1.m_i.m_i <= QVar10.y2.m_i.m_i &&
      (*(long *)(*(long *)(*(long *)&parent->field_0x8 + 0x78) + 0x10) == 0)))) {
    bVar7 = isOverlapped(this,&local_80);
    if (bVar7) goto LAB_0030ce0e;
    bVar7 = isOverlapped(this,&local_70);
    if (bVar7) goto LAB_0030ce0e;
    this_03 = maybeRepaintManager(*(QWidgetPrivate **)&parent->field_0x8);
    childExpose.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    _parentExpose = (QRect)QRect::operator&(&local_60,&local_50);
    QRegion::QRegion(&childExpose,(QRect *)&parentExpose,Rectangle);
    bVar7 = QWidgetRepaintManager::bltRect((QWidgetRepaintManager *)this_03,&local_80,dx,dy,this_01)
    ;
    if (bVar7) {
      QRegion::QRegion(&parentExpose,&local_70,Rectangle);
      QRegion::operator-=(&childExpose,&parentExpose);
      QRegion::~QRegion(&parentExpose);
    }
    if ((this_01->data->widget_attributes & 0x400) == 0) {
      uVar1 = this_00->data->widget_attributes;
      if ((uVar1 >> 10 & 1) == 0) {
        cVar8 = QRegion::isEmpty();
        if (cVar8 == '\0') {
          uVar4._0_4_ = (this->data).crect.x1;
          uVar4._4_4_ = (this->data).crect.y1;
          parentExpose.d =
               (QRegionData *)((ulong)(uint)-(undefined4)uVar4 - (uVar4 & 0xffffffff00000000));
          QRegion::translate(&childExpose,(QPoint *)&parentExpose);
          QWidgetRepaintManager::markDirty<QRegion>
                    ((QWidgetRepaintManager *)this_03,&childExpose,this_00,UpdateLater,BufferValid);
          this->field_0x252 = this->field_0x252 | 0x20;
        }
      }
      parentExpose.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(&parentExpose,&local_90,Rectangle);
      QRegion::QRegion(&parentRegion,&local_60,Rectangle);
      QRegion::operator-=(&parentExpose,&parentRegion);
      QRegion::~QRegion(&parentRegion);
      pQVar2 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t
               .super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
      if ((pQVar2 != (QWExtra *)0x0) && ((pQVar2->field_0x7c & 0x80) != 0)) {
        QRegion::QRegion((QRegion *)&local_c0,&local_60,Rectangle);
        QRegion::translated(&local_c8,
                            (QPoint *)
                            &((this->extra)._M_t.
                              super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                              super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                              super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->mask);
        QRegion::operator-(&parentRegion,(QRegion *)&local_c0);
        QRegion::operator+=(&parentExpose,&parentRegion);
        QRegion::~QRegion(&parentRegion);
        QRegion::~QRegion(&local_c8);
        QRegion::~QRegion((QRegion *)&local_c0);
      }
      cVar8 = QRegion::isEmpty();
      if (cVar8 == '\0') {
        QWidgetRepaintManager::markDirty<QRegion>
                  ((QWidgetRepaintManager *)this_03,&parentExpose,this_01,UpdateLater,BufferValid);
        this_02->field_0x252 = this_02->field_0x252 | 0x20;
      }
      if ((uVar1 >> 10 & 1) == 0) {
        parentRegion.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion(&parentRegion,&local_80,Rectangle);
        QRegion::operator+=(&parentRegion,&local_70);
        QWidgetRepaintManager::markNeedsFlush
                  ((QWidgetRepaintManager *)this_03,this_01,&parentRegion,&local_40);
        QRegion::~QRegion(&parentRegion);
      }
      QRegion::~QRegion(&parentExpose);
    }
    r = &childExpose;
  }
  else {
LAB_0030ce0e:
    parentRegion.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    _parentExpose = effectiveRectFor(this,&local_90);
    QRegion::QRegion(&parentRegion,(QRect *)&parentExpose,Rectangle);
    pQVar2 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if ((pQVar2 == (QWExtra *)0x0) || ((pQVar2->field_0x7c & 0x80) == 0)) {
      QRegion::QRegion(&parentExpose,&local_60,Rectangle);
      QRegion::operator-=(&parentRegion,&parentExpose);
      QRegion::~QRegion(&parentExpose);
    }
    else {
      _parentExpose = (QRect)QRect::operator&(&local_60,&local_50);
      QRegion::operator+=(&parentRegion,(QRect *)&parentExpose);
    }
    r = &parentRegion;
    invalidateBackingStore<QRegion>(this_02,r);
    childExpose.d = (QRegionData *)QRect::operator&(&local_60,&local_50);
    uVar3._0_4_ = (this->data).crect.x1;
    uVar3._4_4_ = (this->data).crect.y1;
    local_c0 = (QPoint)((ulong)(uint)-(undefined4)uVar3 - (uVar3 & 0xffffffff00000000));
    _parentExpose = QRect::translated((QRect *)&childExpose,&local_c0);
    invalidateBackingStore<QRect>(this,(QRect *)&parentExpose);
  }
  QRegion::~QRegion(r);
LAB_0030cf16:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::moveRect(const QRect &rect, int dx, int dy)
{
    Q_Q(QWidget);
    if (!q->isVisible() || (dx == 0 && dy == 0))
        return;

    QWidget *tlw = q->window();

    static const bool accelEnv = qEnvironmentVariableIntValue("QT_NO_FAST_MOVE") == 0;

    QWidget *parentWidget = q->parentWidget();
    QPoint toplevelOffset = parentWidget->mapTo(tlw, QPoint());
    QWidgetPrivate *parentPrivate = parentWidget->d_func();
    const QRect clipR(parentPrivate->clipRect());
    const QRect newRect(rect.translated(dx, dy));
    QRect destRect = rect.intersected(clipR);
    if (destRect.isValid())
        destRect = destRect.translated(dx, dy).intersected(clipR);
    const QRect sourceRect(destRect.translated(-dx, -dy));
    const QRect parentRect(rect & clipR);
    const bool nativeWithTextureChild = textureChildSeen && hasPlatformWindow(q);

    bool accelerateMove = accelEnv && isOpaque && !nativeWithTextureChild && sourceRect.isValid()
#if QT_CONFIG(graphicsview)
                          // No accelerate move for proxy widgets.
                          && !tlw->d_func()->extra->proxyWidget
#endif
                          && !isOverlapped(sourceRect) && !isOverlapped(destRect);

    if (!accelerateMove) {
        QRegion parentRegion(effectiveRectFor(parentRect));
        if (!extra || !extra->hasMask) {
            parentRegion -= newRect;
        } else {
            // invalidateBackingStore() excludes anything outside the mask
            parentRegion += newRect & clipR;
        }
        parentPrivate->invalidateBackingStore(parentRegion);
        invalidateBackingStore((newRect & clipR).translated(-data.crect.topLeft()));
    } else {
        QWidgetRepaintManager *repaintManager = QWidgetPrivate::get(tlw)->maybeRepaintManager();
        Q_ASSERT(repaintManager);
        QRegion childExpose(newRect & clipR);

        if (repaintManager->bltRect(sourceRect, dx, dy, parentWidget))
            childExpose -= destRect;

        if (!parentWidget->updatesEnabled())
            return;

        const bool childUpdatesEnabled = q->updatesEnabled();

        if (childUpdatesEnabled && !childExpose.isEmpty()) {
            childExpose.translate(-data.crect.topLeft());
            repaintManager->markDirty(childExpose, q);
            isMoved = true;
        }

        QRegion parentExpose(parentRect);
        parentExpose -= newRect;
        if (extra && extra->hasMask)
            parentExpose += QRegion(newRect) - extra->mask.translated(data.crect.topLeft());

        if (!parentExpose.isEmpty()) {
            repaintManager->markDirty(parentExpose, parentWidget);
            parentPrivate->isMoved = true;
        }

        if (childUpdatesEnabled) {
            QRegion needsFlush(sourceRect);
            needsFlush += destRect;
            repaintManager->markNeedsFlush(parentWidget, needsFlush, toplevelOffset);
        }
    }
}